

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_ast_enum(FILE *out,AST_Type op)

{
  AST_Type op_local;
  FILE *out_local;
  
  switch(op) {
  case OP_COMMA:
    fprintf((FILE *)out,",");
    break;
  case OP_ADDITION:
    fprintf((FILE *)out,"+");
    break;
  case OP_SUBTRACTION:
    fprintf((FILE *)out,"-");
    break;
  case OP_MUL:
    fprintf((FILE *)out,"*");
    break;
  case OP_DIV:
    fprintf((FILE *)out,"/");
    break;
  case OP_REMAINDER:
    fprintf((FILE *)out,"%");
    break;
  case OP_COND:
    fprintf((FILE *)out,"CONDITIONAL");
    break;
  case OP_FUNCTION:
    fprintf((FILE *)out,"FUNCTION_CALL");
    break;
  case OP_ASSIGN:
    fprintf((FILE *)out,"=");
    break;
  case OP_ADD_ASSIGN:
    fprintf((FILE *)out,"+=");
    break;
  case OP_SUBTRACT_ASSIGN:
    fprintf((FILE *)out,"-=");
    break;
  case OP_MULTIPLY_ASSIGN:
    fprintf((FILE *)out,"*=");
    break;
  case OP_REMAINDER_ASSIGN:
    fprintf((FILE *)out,"%=");
    break;
  case OP_DIV_ASSIGN:
    fprintf((FILE *)out,"/=");
    break;
  case OP_SHIFT_LEFT_ASSIGN:
    fprintf((FILE *)out,">>=");
    break;
  case OP_SHIFT_RIGHT_ASSIGN:
    fprintf((FILE *)out,"<<=");
    break;
  case OP_AND_ASSIGN:
    fprintf((FILE *)out,"&=");
    break;
  case OP_XOR_ASSIGN:
    fprintf((FILE *)out,"^=");
    break;
  case OP_PIPE_ASSIGN:
    fprintf((FILE *)out,"|=");
    break;
  case OP_NOP:
    fprintf((FILE *)out,"NOP");
    break;
  case OP_LOGICAL_OR:
    fprintf((FILE *)out,"||");
    break;
  case OP_LOGICAL_AND:
    fprintf((FILE *)out,"&&");
    break;
  case OP_LOGICAL_NOT:
    fprintf((FILE *)out,"!");
    break;
  case OP_BITWISE_OR:
    fprintf((FILE *)out,"|");
    break;
  case OP_BITWISE_AND:
    fprintf((FILE *)out,"&");
    break;
  case OP_BITWISE_XOR:
    fprintf((FILE *)out,"^");
    break;
  case OP_BITWISE_NOT:
    fprintf((FILE *)out,"~");
    break;
  case OP_ADDR_OF:
    fprintf((FILE *)out,"&");
    break;
  case OP_DEREFERENCE:
    fprintf((FILE *)out,"*");
    break;
  case OP_MEMBER_TROUGH_PTR:
    fprintf((FILE *)out,"->");
    break;
  case OP_MEMBER:
    fprintf((FILE *)out,".");
    break;
  case OP_ARR_SUBSCRIPT:
    fprintf((FILE *)out,"ARR_SUBSCRIPT");
    break;
  case OP_POSTFIX_INC:
    fprintf((FILE *)out,"++");
    break;
  case OP_POSTFIX_DEC:
    fprintf((FILE *)out,"--");
    break;
  case OP_PREFIX_INC:
    fprintf((FILE *)out,"++");
    break;
  case OP_PREFIX_DEC:
    fprintf((FILE *)out,"--");
    break;
  case OP_UNARY_PLUS:
    fprintf((FILE *)out,"+");
    break;
  case OP_UNARY_MINUS:
    fprintf((FILE *)out,"-");
    break;
  case OP_CAST:
    fprintf((FILE *)out,"CAST");
    break;
  case OP_SIZEOF:
    fprintf((FILE *)out,"sizeof");
    break;
  case OP_SHIFT_LEFT:
    fprintf((FILE *)out,"<<");
    break;
  case OP_SHIFT_RIGHT:
    fprintf((FILE *)out,">>");
    break;
  case OP_LESS_EQ:
    fprintf((FILE *)out,"<=");
    break;
  case OP_GREATER_EQ:
    fprintf((FILE *)out,">=");
    break;
  case OP_LESS:
    fprintf((FILE *)out,"<");
    break;
  case OP_GREATER:
    fprintf((FILE *)out,">");
    break;
  case OP_EQUAL:
    fprintf((FILE *)out,"==");
    break;
  case OP_NOT_EQUAL:
    fprintf((FILE *)out,"!=");
    break;
  case OP_LVALUE:
    fprintf((FILE *)out,"LVALUE");
    break;
  case OP_CONSTANT:
    fprintf((FILE *)out,"CONSTANT");
    break;
  case OP_STRING_LITERAL:
    fprintf((FILE *)out,"STRING_LITERAL");
    break;
  case ST_COMPOUND:
    fprintf((FILE *)out,"COMPOUND");
    break;
  case ST_EXPRESSION:
    fprintf((FILE *)out,"EXPRESSION");
    break;
  case ST_SWITCH:
    fprintf((FILE *)out,"switch");
    break;
  case ST_IF:
    fprintf((FILE *)out,"if");
    break;
  case ST_WHILE:
    fprintf((FILE *)out,"while");
    break;
  case ST_DO_WHILE:
    fprintf((FILE *)out,"do_while");
    break;
  case ST_GOTO:
    fprintf((FILE *)out,"goto");
    break;
  case ST_LABEL:
    fprintf((FILE *)out,"LABEL");
    break;
  case ST_CASE:
    fprintf((FILE *)out,"case");
    break;
  case ST_DEFAULT:
    fprintf((FILE *)out,"default");
    break;
  case ST_CONTINUE:
    fprintf((FILE *)out,"continue");
    break;
  case ST_BREAK:
    fprintf((FILE *)out,"break");
    break;
  case ST_RETURN:
    fprintf((FILE *)out,"return");
    break;
  case ST_FOR:
    fprintf((FILE *)out,"for");
    break;
  default:
    fprintf((FILE *)out,"NOT_POSSIBLE");
    break;
  case ST_FUNCTION_DEFINITION:
    fprintf((FILE *)out,"FUNCTION_DEFINITION");
    break;
  case TRANSLATION_UNIT:
    fprintf((FILE *)out,"TRANSLATION_UNIT");
    break;
  case ERROR:
    fprintf((FILE *)out,"ERROR");
  }
  return;
}

Assistant:

void print_ast_enum(FILE *out,enum AST_Type op)
{
	switch(op)
	{
	case OP_COMMA:
		fprintf(out,",");break;
	case OP_ADDITION:
		fprintf(out,"+");break;
	case OP_SUBTRACTION:
		fprintf(out,"-");break;
	case OP_MUL:
		fprintf(out,"*");break;
	case OP_DIV:
		fprintf(out,"/");break;
	case OP_REMAINDER:
		fprintf(out,"%");break;
	case OP_COND:
		fprintf(out,"CONDITIONAL");break;
	case OP_FUNCTION:
		fprintf(out,"FUNCTION_CALL");break;
	case OP_ASSIGN:
		fprintf(out,"=");break;
	case OP_ADD_ASSIGN:
		fprintf(out,"+=");break;
	case OP_SUBTRACT_ASSIGN:
		fprintf(out,"-=");break;
	case OP_MULTIPLY_ASSIGN:
		fprintf(out,"*=");break;
	case OP_REMAINDER_ASSIGN:
		fprintf(out,"%=");break;
	case OP_DIV_ASSIGN:
		fprintf(out,"/=");break;
	case OP_SHIFT_LEFT_ASSIGN:
		fprintf(out,">>=");break;
	case OP_SHIFT_RIGHT_ASSIGN:
		fprintf(out,"<<=");break;
	case OP_AND_ASSIGN:
		fprintf(out,"&=");break;
	case OP_XOR_ASSIGN:
		fprintf(out,"^=");break;
	case OP_PIPE_ASSIGN:
		fprintf(out,"|=");break;
	case OP_NOP:
		fprintf(out,"NOP");break;
	case OP_LOGICAL_OR:
		fprintf(out,"||");break;
	case OP_LOGICAL_AND:
		fprintf(out,"&&");break;
	case OP_LOGICAL_NOT:
		fprintf(out,"!");break;
	case OP_BITWISE_OR:
		fprintf(out,"|");break;
	case OP_BITWISE_AND:
		fprintf(out,"&");break;
	case OP_BITWISE_XOR:
		fprintf(out,"^");break;
	case OP_BITWISE_NOT:
		fprintf(out,"~");break;
	case OP_ADDR_OF:
		fprintf(out,"&");break;
	case OP_DEREFERENCE:
		fprintf(out,"*");break;
	case OP_MEMBER_TROUGH_PTR:
		fprintf(out,"->");break;
	case OP_MEMBER:
		fprintf(out,".");break;
	case OP_ARR_SUBSCRIPT:
		fprintf(out,"ARR_SUBSCRIPT");break;
	case OP_POSTFIX_INC:
		fprintf(out,"++");break;
	case OP_POSTFIX_DEC:
		fprintf(out,"--");break;
	case OP_PREFIX_INC:
		fprintf(out,"++");break;
	case OP_PREFIX_DEC:
		fprintf(out,"--");break;
	case OP_UNARY_PLUS:
		fprintf(out,"+");break;
	case OP_UNARY_MINUS:
		fprintf(out,"-");break;
	case OP_CAST:
		fprintf(out,"CAST");break;
	case OP_SIZEOF:
		fprintf(out,"sizeof");break;
	case OP_SHIFT_LEFT:
		fprintf(out,"<<");break;
	case OP_SHIFT_RIGHT:
		fprintf(out,">>");break;
	case OP_LESS_EQ:
		fprintf(out,"<=");break;
	case OP_GREATER_EQ:
		fprintf(out,">=");break;
	case OP_LESS:
		fprintf(out,"<");break;
	case OP_GREATER:
		fprintf(out,">");break;
	case OP_EQUAL:
		fprintf(out,"==");break;
	case OP_NOT_EQUAL:
		fprintf(out,"!=");break;
	case OP_LVALUE:
		fprintf(out,"LVALUE");break;
	case OP_CONSTANT:
		fprintf(out,"CONSTANT");break;
	case OP_STRING_LITERAL:
		fprintf(out,"STRING_LITERAL");break;
	case ST_COMPOUND:
		fprintf(out,"COMPOUND");break;
	case ST_EXPRESSION:
		fprintf(out,"EXPRESSION");break;
	case ST_SWITCH:
		fprintf(out,"switch");break;
	case ST_IF:
		fprintf(out,"if");break;
	case ST_WHILE:
		fprintf(out,"while");break;
	case ST_DO_WHILE:
		fprintf(out,"do_while");break;
	case ST_GOTO:
		fprintf(out,"goto");break;
	case ST_LABEL:
		fprintf(out,"LABEL");break;
	case ST_CASE:
		fprintf(out,"case");break;
	case ST_DEFAULT:
		fprintf(out,"default");break;
	case ST_CONTINUE:
		fprintf(out,"continue");break;
	case ST_BREAK:
		fprintf(out,"break");break;
	case ST_RETURN:
		fprintf(out,"return");break;
	case ST_FOR:
		fprintf(out,"for");break;
	
		/*TODO obj dec obj def func decl*/
	case ST_FUNCTION_DEFINITION:
		fprintf(out,"FUNCTION_DEFINITION");break;
	case TRANSLATION_UNIT:
		fprintf(out,"TRANSLATION_UNIT");break;
	case ERROR:
		fprintf(out,"ERROR");break;
		default:
			fprintf(out,"NOT_POSSIBLE");break;
	}
}